

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

bool __thiscall
docopt::Either::match
          (Either *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  pointer *this_00;
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  int iVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  undefined1 local_88 [8];
  PatternList l;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
  outcomes;
  
  c.
  super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    this_00 = &l.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)local_88,left);
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                *)this_00,collected);
      peVar2 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (*peVar2->_vptr_Pattern[2])
                        (peVar2,(vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                 *)local_88,this_00);
      if ((char)iVar4 != '\0') {
        std::
        vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>>>
        ::
        emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>
                  ((vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>>>
                    *)&c.
                       super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)local_88,
                   (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                    *)this_00);
      }
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::~vector((vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                 *)this_00);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)local_88);
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  psVar5 = c.
           super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3;
  psVar6 = c.
           super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar5 != (pointer)0x0 &&
      c.
      super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    do {
      psVar3 = psVar5;
      if ((ulong)((long)(psVar6->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi -
                 (long)(psVar6->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr) <=
          (ulong)((long)(psVar5->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi -
                 (long)(psVar5->super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)) {
        psVar3 = psVar6;
      }
      psVar6 = psVar3;
      psVar5 = psVar5 + 3;
    } while (psVar5 != (pointer)0x0);
  }
  if (psVar6 != (pointer)0x0) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    _M_move_assign(left,psVar6);
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::_M_move_assign(collected,
                     &psVar6[1].super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  }
  std::
  vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
  ::~vector((vector<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>,_std::allocator<std::pair<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>_>_>
             *)&c.
                super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return psVar6 != (pointer)0x0;
}

Assistant:

inline bool Either::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		using Outcome = std::pair<PatternList, std::vector<std::shared_ptr<LeafPattern>>>;

		std::vector<Outcome> outcomes;

		for(auto const& pattern : fChildren) {
			// need a copy so we apply the same one for every iteration
			auto l = left;
			auto c = collected;
			bool matched = pattern->match(l, c);
			if (matched) {
				outcomes.emplace_back(std::move(l), std::move(c));
			}
		}

		auto min = std::min_element(outcomes.begin(), outcomes.end(), [](Outcome const& o1, Outcome const& o2) {
			return o1.first.size() < o2.first.size();
		});

		if (min == outcomes.end()) {
			// (left, collected) unchanged
			return false;
		}

		std::tie(left, collected) = std::move(*min);
		return true;
	}